

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashids.cpp
# Opt level: O3

void __thiscall hashidsxx::Hashids::Hashids(Hashids *this,Hashids *that)

{
  pointer pcVar1;
  
  this->_vptr_Hashids = (_func_int **)&PTR__Hashids_00297460;
  (this->_salt)._M_dataplus._M_p = (pointer)&(this->_salt).field_2;
  pcVar1 = (that->_salt)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_salt,pcVar1,pcVar1 + (that->_salt)._M_string_length);
  (this->_alphabet)._M_dataplus._M_p = (pointer)&(this->_alphabet).field_2;
  pcVar1 = (that->_alphabet)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_alphabet,pcVar1,pcVar1 + (that->_alphabet)._M_string_length);
  this->_min_length = that->_min_length;
  (this->_separators)._M_dataplus._M_p = (pointer)&(this->_separators).field_2;
  pcVar1 = (that->_separators)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_separators,pcVar1,pcVar1 + (that->_separators)._M_string_length);
  (this->_guards)._M_dataplus._M_p = (pointer)&(this->_guards).field_2;
  pcVar1 = (that->_guards)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_guards,pcVar1,pcVar1 + (that->_guards)._M_string_length);
  return;
}

Assistant:

Hashids::Hashids(const Hashids &that)
    : _salt(that._salt), _alphabet(that._alphabet),
      _min_length(that._min_length), _separators(that._separators),
      _guards(that._guards) {}